

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int side1_4d_filter(double *p0,double *p1,double *q0)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar6 = *p0;
  dVar15 = p0[1];
  dVar17 = dVar6 - *p1;
  dVar11 = dVar15 - p1[1];
  dVar1 = p0[2];
  dVar7 = dVar1 - p1[2];
  dVar2 = p0[3];
  dVar4 = dVar2 - p1[3];
  dVar9 = *p1 - dVar6;
  dVar10 = p1[1] - dVar15;
  dVar8 = p1[2] - dVar1;
  dVar5 = p1[3] - dVar2;
  dVar14 = ABS(dVar9);
  dVar18 = ABS(dVar17);
  dVar16 = ABS(dVar11);
  dVar13 = dVar16;
  if (dVar16 <= dVar18) {
    dVar13 = dVar18;
  }
  if (dVar18 <= dVar14) {
    dVar18 = dVar14;
  }
  if (dVar16 <= dVar18) {
    dVar16 = dVar18;
  }
  dVar18 = ABS(dVar7);
  dVar14 = dVar18;
  if (dVar18 <= dVar16) {
    dVar14 = dVar16;
  }
  dVar16 = ABS(dVar4);
  dVar12 = dVar16;
  if (dVar16 <= dVar14) {
    dVar12 = dVar14;
  }
  dVar14 = ABS(dVar10);
  if (dVar14 <= dVar12) {
    dVar14 = dVar12;
  }
  dVar12 = ABS(dVar8);
  if (dVar12 <= dVar14) {
    dVar12 = dVar14;
  }
  dVar14 = ABS(dVar5);
  if (dVar14 <= dVar12) {
    dVar14 = dVar12;
  }
  if (dVar18 <= dVar13) {
    dVar18 = dVar13;
  }
  if (dVar16 <= dVar18) {
    dVar16 = dVar18;
  }
  dVar13 = ABS(*q0 - dVar6);
  if (dVar13 <= dVar16) {
    dVar13 = dVar16;
  }
  dVar16 = ABS(q0[1] - dVar15);
  if (dVar16 <= dVar13) {
    dVar16 = dVar13;
  }
  dVar13 = ABS(q0[2] - dVar1);
  if (dVar13 <= dVar16) {
    dVar13 = dVar16;
  }
  dVar16 = ABS(q0[3] - dVar2);
  if (dVar16 <= dVar13) {
    dVar16 = dVar13;
  }
  dVar13 = dVar14;
  dVar18 = dVar16;
  if ((dVar16 <= dVar14) && (dVar13 = dVar16, dVar16 < dVar14)) {
    dVar18 = dVar14;
  }
  iVar3 = 0;
  if ((1.8581679070329353e-147 <= dVar13) && (dVar18 <= 5.599361855444509e+101)) {
    dVar6 = dVar5 * (q0[3] - dVar2) +
            dVar8 * (q0[2] - dVar1) + dVar9 * (*q0 - dVar6) + dVar10 * (q0[1] - dVar15);
    dVar15 = dVar14 * dVar16 * 6.444281772791857e-15;
    dVar6 = (dVar4 * dVar4 + dVar7 * dVar7 + dVar17 * dVar17 + dVar11 * dVar11) - (dVar6 + dVar6);
    iVar3 = 1;
    if ((dVar6 <= dVar15) && (iVar3 = 0, dVar6 < -dVar15)) {
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

inline int side1_4d_filter( const double* p0, const double* p1, const double* q0) {
    double p0_0_p1_0 = (p0[0] - p1[0]);
    double p0_1_p1_1 = (p0[1] - p1[1]);
    double p0_2_p1_2 = (p0[2] - p1[2]);
    double p0_3_p1_3 = (p0[3] - p1[3]);
    double r;
    r = (1 * ((((p0_0_p1_0 * p0_0_p1_0) + (p0_1_p1_1 * p0_1_p1_1)) + (p0_2_p1_2 * p0_2_p1_2)) + (p0_3_p1_3 * p0_3_p1_3)));
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    r = (r - (2 * ((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p1_0_p0_0);
    if( (max1 < fabs(p0_0_p1_0)) )
    {
        max1 = fabs(p0_0_p1_0);
    } 
    if( (max1 < fabs(p0_1_p1_1)) )
    {
        max1 = fabs(p0_1_p1_1);
    } 
    if( (max1 < fabs(p0_2_p1_2)) )
    {
        max1 = fabs(p0_2_p1_2);
    } 
    if( (max1 < fabs(p0_3_p1_3)) )
    {
        max1 = fabs(p0_3_p1_3);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    double max2 = fabs(p0_0_p1_0);
    if( (max2 < fabs(p0_1_p1_1)) )
    {
        max2 = fabs(p0_1_p1_1);
    } 
    if( (max2 < fabs(p0_2_p1_2)) )
    {
        max2 = fabs(p0_2_p1_2);
    } 
    if( (max2 < fabs(p0_3_p1_3)) )
    {
        max2 = fabs(p0_3_p1_3);
    } 
    if( (max2 < fabs(q0_0_p0_0)) )
    {
        max2 = fabs(q0_0_p0_0);
    } 
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (lower_bound_1 < 1.85816790703293534018e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 5.59936185544450928309e+101) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (6.44428177279185717888e-15 * (max1 * max2));
        if( (r > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}